

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Token * __thiscall JSON::Parser::readToken(Token *__return_storage_ptr__,Parser *this)

{
  code *pcVar1;
  bool bVar2;
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  int local_20;
  int local_1c;
  int startPos;
  int code;
  Parser *this_local;
  
  _startPos = this;
  this_local = (Parser *)__return_storage_ptr__;
  local_1c = getCodeAt(this,this->pos);
  bVar2 = isNumberChar(local_1c);
  if ((bVar2) || (local_1c == 0x2d)) {
    readNumberToken(__return_storage_ptr__,this);
  }
  else {
    bVar2 = isWordChar(local_1c);
    if (bVar2) {
      readWordToken(__return_storage_ptr__,this);
    }
    else {
      local_20 = this->pos;
      if (local_1c == 0x22) {
        readStringToken(__return_storage_ptr__,this);
      }
      else if (local_1c == 0x2c) {
        this->pos = this->pos + 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_118,",",&local_119);
        Token::Token(__return_storage_ptr__,COMMA,(string *)local_118,local_20,this->pos);
        std::__cxx11::string::~string(local_118);
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
      }
      else if (local_1c == 0x3a) {
        this->pos = this->pos + 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f0,":",&local_f1);
        Token::Token(__return_storage_ptr__,SEPARATOR,(string *)local_f0,local_20,this->pos);
        std::__cxx11::string::~string(local_f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      }
      else if (local_1c == 0x5b) {
        this->pos = this->pos + 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a0,"[",&local_a1);
        Token::Token(__return_storage_ptr__,BRACKETS_START,(string *)local_a0,local_20,this->pos);
        std::__cxx11::string::~string(local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      }
      else if (local_1c == 0x5d) {
        this->pos = this->pos + 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c8,"]",&local_c9);
        Token::Token(__return_storage_ptr__,BRACKETS_END,(string *)local_c8,local_20,this->pos);
        std::__cxx11::string::~string(local_c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      }
      else if (local_1c == 0x7b) {
        this->pos = this->pos + 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_40,"{",&local_41);
        Token::Token(__return_storage_ptr__,BRACES_START,(string *)local_40,local_20,this->pos);
        std::__cxx11::string::~string(local_40);
        std::allocator<char>::~allocator((allocator<char> *)&local_41);
      }
      else {
        if (local_1c != 0x7d) {
          unexpected(this,this->pos);
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        this->pos = this->pos + 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_78,"}",&local_79);
        Token::Token(__return_storage_ptr__,BRACES_END,(string *)local_78,local_20,this->pos);
        std::__cxx11::string::~string(local_78);
        std::allocator<char>::~allocator((allocator<char> *)&local_79);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Token Parser::readToken() {
        int code = getCodeAt(pos);

        if (isNumberChar(code) || code == 45) { // 0-9 or '-'
            return readNumberToken();
        } else if (isWordChar(code)) { // A-Z or a-z
            return readWordToken();
        }

        int startPos = pos;
        switch (code) {
            case 123: // '{'
                pos++;
                return Token(BRACES_START, "{", startPos, pos);
            case 125: // '}'
                pos++;
                return Token(BRACES_END, "}", startPos, pos);
            case 91: // '['
                pos++;
                return Token(BRACKETS_START, "[", startPos, pos);
            case 93: // ']'
                pos++;
                return Token(BRACKETS_END, "]", startPos, pos);
            case 58: // ':'
                pos++;
                return Token(SEPARATOR, ":", startPos, pos);
            case 44: // ','
                pos++;
                return Token(COMMA, ",", startPos, pos);
            case 34: // '"'
                return readStringToken();
            default:;
                unexpected(pos);
        }
    }